

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereSplit(WhereClause *pWC,Expr *pExpr,u8 op)

{
  Expr *p;
  ExprList_item *pEVar1;
  
  p = pExpr;
  if (pExpr != (Expr *)0x0) {
    do {
      while ((pExpr->flags >> 0xc & 1) == 0) {
        pWC->op = op;
        if (pExpr->op != op) {
          whereClauseInsert(pWC,p,0);
          return;
        }
        sqlite3WhereSplit(pWC,pExpr->pLeft,op);
        pExpr = pExpr->pRight;
        p = pExpr;
        if (pExpr == (Expr *)0x0) goto LAB_0016c392;
      }
      if ((pExpr->flags >> 0x12 & 1) == 0) {
        pEVar1 = (ExprList_item *)&pExpr->pLeft;
      }
      else {
        pEVar1 = ((pExpr->x).pList)->a;
      }
      pExpr = pEVar1->pExpr;
    } while (pExpr != (Expr *)0x0);
  }
LAB_0016c392:
  pWC->op = op;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereSplit(WhereClause *pWC, Expr *pExpr, u8 op){
  Expr *pE2 = sqlite3ExprSkipCollate(pExpr);
  pWC->op = op;
  if( pE2==0 ) return;
  if( pE2->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    sqlite3WhereSplit(pWC, pE2->pLeft, op);
    sqlite3WhereSplit(pWC, pE2->pRight, op);
  }
}